

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall backend::codegen::Codegen::translate_inst(Codegen *this,PtrOffsetInst *i)

{
  mapped_type *pmVar1;
  ulong uVar2;
  pointer *__ptr;
  _Head_base<0UL,_arm::Arith3Inst_*,_false> *this_00;
  Reg reg;
  Reg num_reg;
  int item_size;
  Value offset_value;
  _Head_base<0UL,_arm::Arith3Inst_*,_false> local_e8;
  _Head_base<0UL,_arm::Arith3Inst_*,_false> local_e0;
  Reg local_d4;
  uint local_d0;
  Reg local_cc;
  _Head_base<0UL,_arm::Inst_*,_false> local_c8;
  Reg local_c0;
  undefined2 local_bc;
  undefined1 local_b8 [20];
  undefined1 local_a4 [12];
  int local_98;
  uint32_t local_90;
  char local_88;
  VarId local_80;
  VarId local_70;
  VarId local_60;
  VarId local_50;
  VarId local_40;
  
  this_00 = &local_e8;
  local_a4._4_4_ = (i->ptr).id;
  pmVar1 = std::
           map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
           ::at(&this->func->variables,(key_type_conflict *)(local_a4 + 4));
  uVar2 = (**(code **)(*(pmVar1->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr[1].super_Displayable._vptr_Displayable + 0x18))();
  if ((uVar2 >> 0x20 & 1) == 0) {
    std::__throw_bad_optional_access();
  }
  local_b8._4_4_ = (int)uVar2;
  mir::inst::Value::Value((Value *)(local_a4 + 4),&i->offset);
  if (local_88 == '\x01') {
    local_cc = alloc_vgp(this);
    local_d4 = alloc_vgp(this);
    local_e0._M_head_impl._0_4_ = 6;
    std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int&,int&>
              ((OpCode *)&local_e8,(uint *)&local_e0,(int *)&local_cc);
    local_c8._M_head_impl = &(local_e8._M_head_impl)->super_Inst;
    local_e8._M_head_impl = (Arith3Inst *)0x0;
    local_b8._8_8_ = &this->inst;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_c8);
    if ((Arith3Inst *)local_c8._M_head_impl != (Arith3Inst *)0x0) {
      (*(((Inst *)&(local_c8._M_head_impl)->super_Displayable)->super_Displayable)._vptr_Displayable
        [2])();
    }
    local_c8._M_head_impl = (Inst *)0x0;
    std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)&local_e8);
    local_d0 = 0xc;
    local_60.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_60.id = local_90;
    local_b8._0_4_ = translate_var_reg(this,&local_60);
    local_c8._M_head_impl = (Inst *)&PTR_display_001db7d0;
    local_c0 = local_cc;
    local_bc = 1;
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int&,unsigned_int,arm::RegisterOperand>
              ((OpCode *)&local_e0,&local_d0,&local_d4,(RegisterOperand *)local_b8);
    local_e8._M_head_impl = local_e0._M_head_impl;
    local_e0._M_head_impl = (Arith3Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)local_b8._8_8_,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_e8
              );
    if (local_e8._M_head_impl != (Arith3Inst *)0x0) {
      (*((local_e8._M_head_impl)->super_Inst).super_Displayable._vptr_Displayable[2])();
    }
    local_e8._M_head_impl = (Arith3Inst *)0x0;
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)&local_e0);
    local_d0 = 9;
    local_70.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_70.id = (i->super_Inst).dest.id;
    local_b8._0_4_ = translate_var_reg(this,&local_70);
    local_80.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_80.id = (i->ptr).id;
    local_a4._0_4_ = translate_var_reg(this,&local_80);
    local_c8._M_head_impl = (Inst *)&PTR_display_001db7d0;
    local_c0 = local_d4;
    local_bc = 1;
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::RegisterOperand>
              ((OpCode *)&local_e0,&local_d0,(uint *)local_b8,(RegisterOperand *)local_a4);
    local_e8._M_head_impl = local_e0._M_head_impl;
    local_e0._M_head_impl = (Arith3Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)local_b8._8_8_,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_e8
              );
    if (local_e8._M_head_impl != (Arith3Inst *)0x0) {
      (*((local_e8._M_head_impl)->super_Inst).super_Displayable._vptr_Displayable[2])();
    }
    local_e8._M_head_impl = (Arith3Inst *)0x0;
    this_00 = &local_e0;
  }
  else {
    if (local_88 != '\0') {
      return;
    }
    local_98 = (int)uVar2 * local_98;
    local_e0._M_head_impl._0_4_ = 9;
    local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_40.id = (i->super_Inst).dest.id;
    local_cc = translate_var_reg(this,&local_40);
    local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_50.id = (i->ptr).id;
    local_d4 = translate_var_reg(this,&local_50);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,int&>
              ((OpCode *)&local_e8,(uint *)&local_e0,&local_cc,(int *)&local_d4);
    local_c8._M_head_impl = &(local_e8._M_head_impl)->super_Inst;
    local_e8._M_head_impl = (Arith3Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_c8);
    if ((Arith3Inst *)local_c8._M_head_impl != (Arith3Inst *)0x0) {
      (*(((Inst *)&(local_c8._M_head_impl)->super_Displayable)->super_Displayable)._vptr_Displayable
        [2])();
    }
    local_c8._M_head_impl = (Inst *)0x0;
  }
  std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
            ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)this_00);
  return;
}

Assistant:

void Codegen::translate_inst(mir::inst::PtrOffsetInst& i) {
  auto& ptr_ty = func.variables.at(i.ptr).ty;
  auto ptr_ty_ = static_cast<mir::types::PtrTy*>(&*ptr_ty);
  auto item_size = ptr_ty_->item->size().value();

  auto offset_value = i.offset;
  if (auto int_val = offset_value.get_if<int32_t>()) {
    *int_val *= item_size;
    inst.push_back(std::make_unique<Arith3Inst>(
        arm::OpCode::Add, translate_var_reg(i.dest), translate_var_reg(i.ptr),
        *int_val));
  } else if (auto var_val = offset_value.get_if<mir::inst::VarId>()) {
    auto num_reg = alloc_vgp();
    auto reg = alloc_vgp();
    inst.push_back(
        std::make_unique<Arith2Inst>(OpCode::Mov, num_reg, item_size));
    inst.push_back(std::make_unique<Arith3Inst>(OpCode::Mul, reg,
                                                translate_var_reg(*var_val),
                                                RegisterOperand(num_reg)));
    inst.push_back(std::make_unique<Arith3Inst>(
        arm::OpCode::Add, translate_var_reg(i.dest), translate_var_reg(i.ptr),
        RegisterOperand(reg)));
  }
}